

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

void __thiscall lf::base::AutoTimer::~AutoTimer(AutoTimer *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if ((this->timer_).is_stopped_ == false) {
    Timer::Stop(&this->timer_);
    Report(this);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
  ::~_Variant_storage((_Variant_storage<false,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                       *)&this->output_);
  pcVar1 = (this->format_)._M_dataplus._M_p;
  paVar2 = &(this->format_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

AutoTimer::~AutoTimer() {
  if (!timer_.IsStopped()) {
    timer_.Stop();
    try {
      Report();

      // NOLINTNEXTLINE(bugprone-empty-catch)
    } catch (...) {  // eat any exceptions
    }
  }
}